

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void selectInnerLoop(Parse *pParse,Select *p,ExprList *pEList,int srcTab,int nColumn,
                    ExprList *pOrderBy,DistinctCtx *pDistinct,SelectDest *pDest,int iContinue,
                    int iBreak)

{
  u8 uVar1;
  u8 uVar2;
  Vdbe *v_00;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  VdbeOp *pVVar8;
  CollSeq *zP4;
  int r1_3;
  int r1_2;
  int r2;
  int r1_1;
  int r1;
  CollSeq *pColl;
  int regPrev;
  int iJump;
  VdbeOp *pOp;
  int nResultCol;
  int iParm;
  int eDest;
  int regResult;
  int hasDistinct;
  int i;
  Vdbe *v;
  ExprList *pOrderBy_local;
  int nColumn_local;
  int srcTab_local;
  ExprList *pEList_local;
  Select *p_local;
  Parse *pParse_local;
  
  v_00 = pParse->pVdbe;
  uVar1 = pDest->eDest;
  iVar7 = pDest->iSDParm;
  if (v_00 != (Vdbe *)0x0) {
    if (pDistinct == (DistinctCtx *)0x0) {
      uVar2 = '\0';
    }
    else {
      uVar2 = pDistinct->eTnctType;
    }
    if ((pOrderBy == (ExprList *)0x0) && (uVar2 == '\0')) {
      codeOffset(v_00,p,iContinue);
    }
    pOp._0_4_ = nColumn;
    if (nColumn < 1) {
      pOp._0_4_ = pEList->nExpr;
    }
    if (pDest->iSdst == 0) {
      pDest->iSdst = pParse->nMem + 1;
      pDest->nSdst = (int)pOp;
      pParse->nMem = (int)pOp + pParse->nMem;
    }
    iVar6 = pDest->iSdst;
    if (nColumn < 1) {
      if (uVar1 != '\x03') {
        sqlite3ExprCacheClear(pParse);
        sqlite3ExprCodeExprList(pParse,pEList,iVar6,(uint)(uVar1 == '\x05'));
      }
    }
    else {
      for (regResult = 0; regResult < nColumn; regResult = regResult + 1) {
        sqlite3VdbeAddOp3(v_00,0x1d,srcTab,regResult,iVar6 + regResult);
      }
    }
    if (uVar2 != '\0') {
      if (pDistinct->eTnctType == '\x01') {
        sqlite3VdbeChangeToNoop(v_00,pDistinct->addrTnct);
      }
      else if (pDistinct->eTnctType == '\x02') {
        iVar4 = pParse->nMem + 1;
        pParse->nMem = (int)pOp + pParse->nMem;
        sqlite3VdbeChangeToNoop(v_00,pDistinct->addrTnct);
        pVVar8 = sqlite3VdbeGetOp(v_00,pDistinct->addrTnct);
        pVVar8->opcode = '\n';
        pVVar8->p1 = 1;
        pVVar8->p2 = iVar4;
        iVar5 = sqlite3VdbeCurrentAddr(v_00);
        for (regResult = 0; regResult < (int)pOp; regResult = regResult + 1) {
          zP4 = sqlite3ExprCollSeq(pParse,pEList->a[regResult].pExpr);
          if (regResult < (int)pOp + -1) {
            sqlite3VdbeAddOp3(v_00,0x4b,iVar6 + regResult,iVar5 + (int)pOp,iVar4 + regResult);
          }
          else {
            sqlite3VdbeAddOp3(v_00,0x4c,iVar6 + regResult,iContinue,iVar4 + regResult);
          }
          sqlite3VdbeChangeP4(v_00,-1,(char *)zP4,-4);
          sqlite3VdbeChangeP5(v_00,0x80);
        }
        sqlite3VdbeAddOp3(v_00,0xe,iVar6,iVar4,(int)pOp + -1);
      }
      else {
        codeDistinct(pParse,pDistinct->tabTnct,iContinue,(int)pOp,iVar6);
      }
      if (pOrderBy == (ExprList *)0x0) {
        codeOffset(v_00,p,iContinue);
      }
    }
    switch(uVar1) {
    case '\x01':
      iVar4 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v_00,0x1f,iVar6,(int)pOp,iVar4);
      sqlite3VdbeAddOp2(v_00,0x61,iVar7,iVar4);
      sqlite3ReleaseTempReg(pParse,iVar4);
      break;
    case '\x02':
      sqlite3VdbeAddOp3(v_00,0x62,iVar7,iVar6,(int)pOp);
      break;
    case '\x03':
      sqlite3VdbeAddOp2(v_00,7,1,iVar7);
      break;
    default:
      break;
    case '\x05':
    case '\n':
      if (pOrderBy == (ExprList *)0x0) {
        if (uVar1 == '\n') {
          sqlite3VdbeAddOp1(v_00,4,pDest->iSDParm);
        }
        else {
          sqlite3VdbeAddOp2(v_00,0x10,iVar6,(int)pOp);
          sqlite3ExprCacheAffinityChange(pParse,iVar6,(int)pOp);
        }
      }
      else {
        iVar7 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp3(v_00,0x1f,iVar6,(int)pOp,iVar7);
        pushOntoSorter(pParse,pOrderBy,p,iVar7);
        sqlite3ReleaseTempReg(pParse,iVar7);
      }
      break;
    case '\x06':
      if (pOrderBy == (ExprList *)0x0) {
        sqlite3ExprCodeMove(pParse,iVar6,iVar7,1);
      }
      else {
        pushOntoSorter(pParse,pOrderBy,p,iVar6);
      }
      break;
    case '\a':
      cVar3 = sqlite3CompareAffinity(pEList->a->pExpr,pDest->affSdst);
      pDest->affSdst = cVar3;
      if (pOrderBy == (ExprList *)0x0) {
        iVar4 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp4(v_00,0x1f,iVar6,1,iVar4,&pDest->affSdst,1);
        sqlite3ExprCacheAffinityChange(pParse,iVar6,1);
        sqlite3VdbeAddOp2(v_00,0x61,iVar7,iVar4);
        sqlite3ReleaseTempReg(pParse,iVar4);
      }
      else {
        pushOntoSorter(pParse,pOrderBy,p,iVar6);
      }
      break;
    case '\b':
    case '\t':
      iVar4 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v_00,0x1f,iVar6,(int)pOp,iVar4);
      if (pOrderBy == (ExprList *)0x0) {
        iVar6 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v_00,0x38,iVar7,iVar6);
        sqlite3VdbeAddOp3(v_00,0x39,iVar7,iVar4,iVar6);
        sqlite3VdbeChangeP5(v_00,'\b');
        sqlite3ReleaseTempReg(pParse,iVar6);
      }
      else {
        pushOntoSorter(pParse,pOrderBy,p,iVar4);
      }
      sqlite3ReleaseTempReg(pParse,iVar4);
    }
    if ((pOrderBy == (ExprList *)0x0) && (p->iLimit != 0)) {
      sqlite3VdbeAddOp3(v_00,0x7a,p->iLimit,iBreak,-1);
    }
  }
  return;
}

Assistant:

static void selectInnerLoop(
  Parse *pParse,          /* The parser context */
  Select *p,              /* The complete select statement being coded */
  ExprList *pEList,       /* List of values being extracted */
  int srcTab,             /* Pull data from this table */
  int nColumn,            /* Number of columns in the source table */
  ExprList *pOrderBy,     /* If not NULL, sort results using this key */
  DistinctCtx *pDistinct, /* If not NULL, info on how to process DISTINCT */
  SelectDest *pDest,      /* How to dispose of the results */
  int iContinue,          /* Jump here to continue with next row */
  int iBreak              /* Jump here to break out of the inner loop */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  int hasDistinct;        /* True if the DISTINCT keyword is present */
  int regResult;              /* Start of memory holding result set */
  int eDest = pDest->eDest;   /* How to dispose of results */
  int iParm = pDest->iSDParm; /* First argument to disposal method */
  int nResultCol;             /* Number of result columns */

  assert( v );
  if( NEVER(v==0) ) return;
  assert( pEList!=0 );
  hasDistinct = pDistinct ? pDistinct->eTnctType : WHERE_DISTINCT_NOOP;
  if( pOrderBy==0 && !hasDistinct ){
    codeOffset(v, p, iContinue);
  }

  /* Pull the requested columns.
  */
  if( nColumn>0 ){
    nResultCol = nColumn;
  }else{
    nResultCol = pEList->nExpr;
  }
  if( pDest->iSdst==0 ){
    pDest->iSdst = pParse->nMem+1;
    pDest->nSdst = nResultCol;
    pParse->nMem += nResultCol;
  }else{ 
    assert( pDest->nSdst==nResultCol );
  }
  regResult = pDest->iSdst;
  if( nColumn>0 ){
    for(i=0; i<nColumn; i++){
      sqlite3VdbeAddOp3(v, OP_Column, srcTab, i, regResult+i);
    }
  }else if( eDest!=SRT_Exists ){
    /* If the destination is an EXISTS(...) expression, the actual
    ** values returned by the SELECT are not required.
    */
    sqlite3ExprCacheClear(pParse);
    sqlite3ExprCodeExprList(pParse, pEList, regResult, eDest==SRT_Output);
  }
  nColumn = nResultCol;

  /* If the DISTINCT keyword was present on the SELECT statement
  ** and this row has been seen before, then do not make this row
  ** part of the result.
  */
  if( hasDistinct ){
    assert( pEList!=0 );
    assert( pEList->nExpr==nColumn );
    switch( pDistinct->eTnctType ){
      case WHERE_DISTINCT_ORDERED: {
        VdbeOp *pOp;            /* No longer required OpenEphemeral instr. */
        int iJump;              /* Jump destination */
        int regPrev;            /* Previous row content */

        /* Allocate space for the previous row */
        regPrev = pParse->nMem+1;
        pParse->nMem += nColumn;

        /* Change the OP_OpenEphemeral coded earlier to an OP_Null
        ** sets the MEM_Cleared bit on the first register of the
        ** previous value.  This will cause the OP_Ne below to always
        ** fail on the first iteration of the loop even if the first
        ** row is all NULLs.
        */
        sqlite3VdbeChangeToNoop(v, pDistinct->addrTnct);
        pOp = sqlite3VdbeGetOp(v, pDistinct->addrTnct);
        pOp->opcode = OP_Null;
        pOp->p1 = 1;
        pOp->p2 = regPrev;

        iJump = sqlite3VdbeCurrentAddr(v) + nColumn;
        for(i=0; i<nColumn; i++){
          CollSeq *pColl = sqlite3ExprCollSeq(pParse, pEList->a[i].pExpr);
          if( i<nColumn-1 ){
            sqlite3VdbeAddOp3(v, OP_Ne, regResult+i, iJump, regPrev+i);
          }else{
            sqlite3VdbeAddOp3(v, OP_Eq, regResult+i, iContinue, regPrev+i);
          }
          sqlite3VdbeChangeP4(v, -1, (const char *)pColl, P4_COLLSEQ);
          sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
        }
        assert( sqlite3VdbeCurrentAddr(v)==iJump );
        sqlite3VdbeAddOp3(v, OP_Copy, regResult, regPrev, nColumn-1);
        break;
      }

      case WHERE_DISTINCT_UNIQUE: {
        sqlite3VdbeChangeToNoop(v, pDistinct->addrTnct);
        break;
      }

      default: {
        assert( pDistinct->eTnctType==WHERE_DISTINCT_UNORDERED );
        codeDistinct(pParse, pDistinct->tabTnct, iContinue, nColumn, regResult);
        break;
      }
    }
    if( pOrderBy==0 ){
      codeOffset(v, p, iContinue);
    }
  }

  switch( eDest ){
    /* In this mode, write each query result to the key of the temporary
    ** table iParm.
    */
#ifndef SQLITE_OMIT_COMPOUND_SELECT
    case SRT_Union: {
      int r1;
      r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nColumn, r1);
      sqlite3VdbeAddOp2(v, OP_IdxInsert, iParm, r1);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

    /* Construct a record from the query result, but instead of
    ** saving that record, use it as a key to delete elements from
    ** the temporary table iParm.
    */
    case SRT_Except: {
      sqlite3VdbeAddOp3(v, OP_IdxDelete, iParm, regResult, nColumn);
      break;
    }
#endif

    /* Store the result as data using a unique key.
    */
    case SRT_Table:
    case SRT_EphemTab: {
      int r1 = sqlite3GetTempReg(pParse);
      testcase( eDest==SRT_Table );
      testcase( eDest==SRT_EphemTab );
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nColumn, r1);
      if( pOrderBy ){
        pushOntoSorter(pParse, pOrderBy, p, r1);
      }else{
        int r2 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_NewRowid, iParm, r2);
        sqlite3VdbeAddOp3(v, OP_Insert, iParm, r1, r2);
        sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

#ifndef SQLITE_OMIT_SUBQUERY
    /* If we are creating a set for an "expr IN (SELECT ...)" construct,
    ** then there should be a single item on the stack.  Write this
    ** item into the set table with bogus data.
    */
    case SRT_Set: {
      assert( nColumn==1 );
      pDest->affSdst =
                  sqlite3CompareAffinity(pEList->a[0].pExpr, pDest->affSdst);
      if( pOrderBy ){
        /* At first glance you would think we could optimize out the
        ** ORDER BY in this case since the order of entries in the set
        ** does not matter.  But there might be a LIMIT clause, in which
        ** case the order does matter */
        pushOntoSorter(pParse, pOrderBy, p, regResult);
      }else{
        int r1 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp4(v, OP_MakeRecord, regResult,1,r1, &pDest->affSdst, 1);
        sqlite3ExprCacheAffinityChange(pParse, regResult, 1);
        sqlite3VdbeAddOp2(v, OP_IdxInsert, iParm, r1);
        sqlite3ReleaseTempReg(pParse, r1);
      }
      break;
    }

    /* If any row exist in the result set, record that fact and abort.
    */
    case SRT_Exists: {
      sqlite3VdbeAddOp2(v, OP_Integer, 1, iParm);
      /* The LIMIT clause will terminate the loop for us */
      break;
    }

    /* If this is a scalar select that is part of an expression, then
    ** store the results in the appropriate memory cell and break out
    ** of the scan loop.
    */
    case SRT_Mem: {
      assert( nColumn==1 );
      if( pOrderBy ){
        pushOntoSorter(pParse, pOrderBy, p, regResult);
      }else{
        sqlite3ExprCodeMove(pParse, regResult, iParm, 1);
        /* The LIMIT clause will jump out of the loop for us */
      }
      break;
    }
#endif /* #ifndef SQLITE_OMIT_SUBQUERY */

    /* Send the data to the callback function or to a subroutine.  In the
    ** case of a subroutine, the subroutine itself is responsible for
    ** popping the data from the stack.
    */
    case SRT_Coroutine:
    case SRT_Output: {
      testcase( eDest==SRT_Coroutine );
      testcase( eDest==SRT_Output );
      if( pOrderBy ){
        int r1 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nColumn, r1);
        pushOntoSorter(pParse, pOrderBy, p, r1);
        sqlite3ReleaseTempReg(pParse, r1);
      }else if( eDest==SRT_Coroutine ){
        sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      }else{
        sqlite3VdbeAddOp2(v, OP_ResultRow, regResult, nColumn);
        sqlite3ExprCacheAffinityChange(pParse, regResult, nColumn);
      }
      break;
    }

#if !defined(SQLITE_OMIT_TRIGGER)
    /* Discard the results.  This is used for SELECT statements inside
    ** the body of a TRIGGER.  The purpose of such selects is to call
    ** user-defined functions that have side effects.  We do not care
    ** about the actual results of the select.
    */
    default: {
      assert( eDest==SRT_Discard );
      break;
    }
#endif
  }

  /* Jump to the end of the loop if the LIMIT is reached.  Except, if
  ** there is a sorter, in which case the sorter has already limited
  ** the output for us.
  */
  if( pOrderBy==0 && p->iLimit ){
    sqlite3VdbeAddOp3(v, OP_IfZero, p->iLimit, iBreak, -1);
  }
}